

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  cmGlobalGenerator *pcVar4;
  string *psVar5;
  char *pcVar6;
  cmGlobalGenerator *gen;
  allocator<char> local_6b1;
  int ret;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  char *local_5a0;
  char *recursionDepth;
  string local_590;
  allocator<char> local_569;
  string local_568;
  char *local_548;
  char *config;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  cmGlobalGenerator *local_448;
  cmGlobalGenerator *gg;
  cmake cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  cmWorkingDirectory workdir;
  bool fast_local;
  string *targetName_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmMakefile *this_local;
  
  this->IsSourceFileTryCompile = fast;
  workdir._39_1_ = fast;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_70,bindir);
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_70);
  if (bVar1) {
    std::operator+(&local_e0,"Failed to set working directory to ",bindir);
    std::operator+(&local_c0,&local_e0," : ");
    iVar3 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_70);
    pcVar6 = strerror(iVar3);
    std::operator+(&local_a0,&local_c0,pcVar6);
    IssueMessage(this,FATAL_ERROR,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    this_local._4_4_ = 1;
    cm.TraceOnlyThisSources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    cmake::cmake((cmake *)&gg,RoleProject,Project);
    cmake::SetIsInTryCompile((cmake *)&gg,true);
    pcVar4 = GetGlobalGenerator(this);
    (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_468);
    pcVar4 = cmake::CreateGlobalGenerator((cmake *)&gg,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    local_448 = pcVar4;
    if (pcVar4 == (cmGlobalGenerator *)0x0) {
      pcVar4 = GetGlobalGenerator(this);
      (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_4c8);
      std::operator+(&local_4a8,"Global generator \'",&local_4c8);
      std::operator+(&local_488,&local_4a8,"\' could not be created.");
      IssueMessage(this,INTERNAL_ERROR,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      cmSystemTools::SetFatalErrorOccured();
      this->IsSourceFileTryCompile = false;
      this_local._4_4_ = 1;
    }
    else {
      pcVar4->RecursionDepth = this->RecursionDepth;
      cmake::SetGlobalGenerator((cmake *)&gg,pcVar4);
      cmake::SetHomeDirectory((cmake *)&gg,srcdir);
      cmake::SetHomeOutputDirectory((cmake *)&gg,bindir);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"CMAKE_GENERATOR_INSTANCE",&local_4e9);
      psVar5 = GetSafeDefinition(this,&local_4e8);
      cmake::SetGeneratorInstance((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"CMAKE_GENERATOR_PLATFORM",&local_511);
      psVar5 = GetSafeDefinition(this,&local_510);
      cmake::SetGeneratorPlatform((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)((long)&config + 7));
      psVar5 = GetSafeDefinition(this,&local_538);
      cmake::SetGeneratorToolset((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
      cmake::LoadCache((cmake *)&gg);
      uVar2 = (*local_448->_vptr_cmGlobalGenerator[0x23])();
      if ((uVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_568,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_569);
        pcVar6 = GetDefinition(this,&local_568);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator(&local_569);
        local_548 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_590,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&recursionDepth + 7));
          cmake::AddCacheEntry((cmake *)&gg,&local_590,local_548,"Build configuration",3);
          std::__cxx11::string::~string((string *)&local_590);
          std::allocator<char>::~allocator((allocator<char> *)((long)&recursionDepth + 7));
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c0,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_5c1);
      pcVar6 = GetDefinition(this,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
      local_5a0 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e8,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_5e9);
        cmake::AddCacheEntry((cmake *)&gg,&local_5e8,local_5a0,"Maximum recursion depth",3);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator(&local_5e9);
      }
      if (cmakeArgs !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        cmake::SetWarnUnusedCli((cmake *)&gg,false);
        cmake::SetCacheArgs((cmake *)&gg,cmakeArgs);
      }
      pcVar4 = local_448;
      gen = GetGlobalGenerator(this);
      cmGlobalGenerator::EnableLanguagesFromGenerator(pcVar4,gen,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_611);
      bVar1 = IsOn(this,&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_638,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_639);
        cmake::AddCacheEntry((cmake *)&gg,&local_638,"TRUE","",4);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator(&local_639);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_660,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_661);
        cmake::AddCacheEntry((cmake *)&gg,&local_660,"FALSE","",4);
        std::__cxx11::string::~string((string *)&local_660);
        std::allocator<char>::~allocator(&local_661);
      }
      iVar3 = cmake::Configure((cmake *)&gg);
      if (iVar3 == 0) {
        iVar3 = cmake::Generate((cmake *)&gg);
        if (iVar3 == 0) {
          pcVar4 = GetGlobalGenerator(this);
          this_local._4_4_ =
               cmGlobalGenerator::TryCompile
                         (pcVar4,jobs,srcdir,bindir,projectName,targetName,
                          (bool)(workdir._39_1_ & 1),output,this);
          this->IsSourceFileTryCompile = false;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ret,"Failed to generate test project build system.",&local_6b1);
          IssueMessage(this,FATAL_ERROR,(string *)&ret);
          std::__cxx11::string::~string((string *)&ret);
          std::allocator<char>::~allocator(&local_6b1);
          cmSystemTools::SetFatalErrorOccured();
          this->IsSourceFileTryCompile = false;
          this_local._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,"Failed to configure test project build system.",&local_689)
        ;
        IssueMessage(this,FATAL_ERROR,&local_688);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator(&local_689);
        cmSystemTools::SetFatalErrorOccured();
        this->IsSourceFileTryCompile = false;
        this_local._4_4_ = 1;
      }
    }
    cm.TraceOnlyThisSources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    cmake::~cmake((cmake *)&gg);
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_70);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  const char* recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}